

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.c
# Opt level: O0

boolean check_tutorial_oclass(int oclass)

{
  boolean local_9;
  int oclass_local;
  
  switch(oclass) {
  case 2:
    check_tutorial_message(0x12d);
    local_9 = '\x01';
    break;
  case 3:
    check_tutorial_message(0x12e);
    local_9 = '\x01';
    break;
  case 4:
    check_tutorial_message(0x132);
    local_9 = '\x01';
    break;
  case 5:
    check_tutorial_message(0x136);
    local_9 = '\x01';
    break;
  case 6:
    check_tutorial_message(0x134);
    local_9 = '\x01';
    break;
  case 7:
    check_tutorial_message(0x12f);
    local_9 = '\x01';
    break;
  case 8:
    check_tutorial_message(0x133);
    local_9 = '\x01';
    break;
  case 9:
    check_tutorial_message(0x130);
    local_9 = '\x01';
    break;
  case 10:
    check_tutorial_message(0x139);
    local_9 = '\x01';
    break;
  case 0xb:
    check_tutorial_message(0x131);
    local_9 = '\x01';
    break;
  case 0xc:
    check_tutorial_message(300);
    local_9 = '\x01';
    break;
  case 0xd:
    check_tutorial_message(0x137);
    local_9 = '\x01';
    break;
  case 0xe:
    check_tutorial_message(0x138);
    local_9 = '\x01';
    break;
  default:
    local_9 = '\0';
  }
  return local_9;
}

Assistant:

boolean check_tutorial_oclass(int oclass)
{
	switch(oclass) {
	case WEAPON_CLASS: check_tutorial_message(QT_T_ITEM_WEAPON);	return TRUE;
	case FOOD_CLASS:   check_tutorial_message(QT_T_ITEM_FOOD);	return TRUE;
	case GEM_CLASS:    check_tutorial_message(QT_T_ITEM_GEM);	return TRUE;
	case TOOL_CLASS:   check_tutorial_message(QT_T_ITEM_TOOL);	return TRUE;
	case AMULET_CLASS: check_tutorial_message(QT_T_ITEM_AMULET);	return TRUE;
	case POTION_CLASS: check_tutorial_message(QT_T_ITEM_POTION);	return TRUE;
	case SCROLL_CLASS: check_tutorial_message(QT_T_ITEM_SCROLL);	return TRUE;
	case SPBOOK_CLASS: check_tutorial_message(QT_T_ITEM_BOOK);	return TRUE;
	case ARMOR_CLASS:  check_tutorial_message(QT_T_ITEM_ARMOR);	return TRUE;
	case WAND_CLASS:   check_tutorial_message(QT_T_ITEM_WAND);	return TRUE;
	case RING_CLASS:   check_tutorial_message(QT_T_ITEM_RING);	return TRUE;
	case ROCK_CLASS:   check_tutorial_message(QT_T_ITEM_STATUE);	return TRUE;
	case COIN_CLASS:   check_tutorial_message(QT_T_ITEM_GOLD);	return TRUE;
	default: return FALSE; /* venom/ball/chain/mimic don't concern us */
	}
}